

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O0

SQInstance * __thiscall SQInstance::Clone(SQInstance *this,SQSharedState *ss)

{
  long lVar1;
  SQUnsignedInteger SVar2;
  SQInstance *pSVar3;
  long in_RDI;
  SQInstance *newinst;
  SQInteger size;
  SQInteger in_stack_00000038;
  SQInstance *in_stack_00000040;
  SQSharedState *in_stack_00000048;
  SQInstance *in_stack_00000050;
  long local_38;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 0x38) + 0x1c0);
  SVar2 = sqvector<SQClassMember>::size
                    ((sqvector<SQClassMember> *)(*(long *)(in_RDI + 0x38) + 0x40));
  if (SVar2 == 0) {
    local_38 = 0;
  }
  else {
    SVar2 = sqvector<SQClassMember>::size
                      ((sqvector<SQClassMember> *)(*(long *)(in_RDI + 0x38) + 0x40));
    local_38 = SVar2 - 1;
  }
  pSVar3 = (SQInstance *)sq_vm_malloc(0x13fd8a);
  SQInstance(in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038);
  if (*(long *)(*(long *)(in_RDI + 0x38) + 0x1c0) != 0) {
    pSVar3->_userpointer =
         (SQUserPointer)
         ((long)pSVar3 +
         ((lVar1 + local_38 * 0x10 + 0x68) - *(long *)(*(long *)(in_RDI + 0x38) + 0x1c0)));
  }
  return pSVar3;
}

Assistant:

SQInstance *Clone(SQSharedState *ss)
    {
        SQInteger size = calcinstancesize(_class);
        SQInstance *newinst = (SQInstance *)SQ_MALLOC(size);
        new (newinst) SQInstance(ss, this,size);
        if(_class->_udsize) {
            newinst->_userpointer = ((unsigned char *)newinst) + (size - _class->_udsize);
        }
        return newinst;
    }